

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

void __thiscall QCborContainerPrivate::removeAt(QCborContainerPrivate *this,qsizetype idx)

{
  QCborValue *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QCborValue *in_stack_ffffffffffffffa0;
  QCborValue *value;
  QCborValue *this_00;
  QCborContainerPrivate *in_stack_ffffffffffffffc0;
  QCborValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_20;
  value = in_RSI;
  ::QCborValue::QCborValue(this_00);
  replaceAt(in_stack_ffffffffffffffc0,(qsizetype)this_00,value,
            (ContainerDisposition)((ulong)in_RDI >> 0x20));
  ::QCborValue::~QCborValue(in_stack_ffffffffffffffa0);
  QList<QtCbor::Element>::remove((QList<QtCbor::Element> *)(in_RDI + 0x28),(char *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void removeAt(qsizetype idx)
    {
        replaceAt(idx, {});
        elements.remove(idx);
    }